

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcuTextureUtil.cpp
# Opt level: O1

Vector<float,_4> __thiscall
tcu::sampleTextureBorder<float>(tcu *this,TextureFormat *format,Sampler *sampler)

{
  int i;
  TextureChannelClass TVar1;
  long lVar2;
  Vector<float,_4> *res;
  float fVar3;
  float fVar4;
  undefined8 in_XMM1_Qa;
  Vec4 VVar5;
  Vector<float,_4> VVar6;
  tcu local_28 [16];
  
  TVar1 = getTextureChannelClass(format->type);
  switch(TVar1) {
  case TEXTURECHANNELCLASS_SIGNED_FIXED_POINT:
  case TEXTURECHANNELCLASS_UNSIGNED_FIXED_POINT:
  case TEXTURECHANNELCLASS_FLOATING_POINT:
    VVar5 = getTextureBorderColorFloat(this,format,sampler);
    in_XMM1_Qa = VVar5.m_data._8_8_;
    fVar3 = VVar5.m_data[0];
    fVar4 = VVar5.m_data[1];
    break;
  case TEXTURECHANNELCLASS_SIGNED_INTEGER:
    getTextureBorderColorInt(local_28,format,sampler);
    *(undefined8 *)this = 0;
    *(undefined8 *)(this + 8) = 0;
    lVar2 = 0;
    do {
      fVar4 = 0.0;
      fVar3 = (float)*(int *)(local_28 + lVar2 * 4);
      *(float *)(this + lVar2 * 4) = fVar3;
      lVar2 = lVar2 + 1;
    } while (lVar2 != 4);
    break;
  case TEXTURECHANNELCLASS_UNSIGNED_INTEGER:
    getTextureBorderColorUint(local_28,format,sampler);
    *(undefined8 *)this = 0;
    *(undefined8 *)(this + 8) = 0;
    lVar2 = 0;
    do {
      fVar4 = 0.0;
      fVar3 = (float)*(uint *)(local_28 + lVar2 * 4);
      *(float *)(this + lVar2 * 4) = fVar3;
      lVar2 = lVar2 + 1;
    } while (lVar2 != 4);
    break;
  default:
    fVar3 = 0.0;
    fVar4 = 0.0;
    *(undefined8 *)this = 0;
    *(undefined8 *)(this + 8) = 0;
  }
  VVar6.m_data[1] = fVar4;
  VVar6.m_data[0] = fVar3;
  VVar6.m_data[2] = (float)(int)in_XMM1_Qa;
  VVar6.m_data[3] = (float)(int)((ulong)in_XMM1_Qa >> 0x20);
  return (Vector<float,_4>)VVar6.m_data;
}

Assistant:

tcu::Vector<ScalarType, 4> sampleTextureBorder (const TextureFormat& format, const Sampler& sampler)
{
	const tcu::TextureChannelClass channelClass = getTextureChannelClass(format.type);

	switch (channelClass)
	{
		case tcu::TEXTURECHANNELCLASS_FLOATING_POINT:
		case tcu::TEXTURECHANNELCLASS_SIGNED_FIXED_POINT:
		case tcu::TEXTURECHANNELCLASS_UNSIGNED_FIXED_POINT:
			return getTextureBorderColorFloat(format, sampler).cast<ScalarType>();

		case tcu::TEXTURECHANNELCLASS_SIGNED_INTEGER:
			return getTextureBorderColorInt(format, sampler).cast<ScalarType>();

		case tcu::TEXTURECHANNELCLASS_UNSIGNED_INTEGER:
			return getTextureBorderColorUint(format, sampler).cast<ScalarType>();

		default:
			DE_ASSERT(false);
			return tcu::Vector<ScalarType, 4>();
	}
}